

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O0

void __thiscall cmFileInstaller::~cmFileInstaller(cmFileInstaller *this)

{
  cmMakefile *this_00;
  char *value;
  allocator<char> local_31;
  string local_30;
  cmFileInstaller *local_10;
  cmFileInstaller *this_local;
  
  (this->super_cmFileCopier)._vptr_cmFileCopier = (_func_int **)&PTR__cmFileInstaller_00a22ec0;
  this_00 = (this->super_cmFileCopier).Makefile;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_INSTALL_MANIFEST_FILES",&local_31);
  value = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(this_00,&local_30,value);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::~string((string *)&this->Manifest);
  std::__cxx11::string::~string((string *)&this->Rename);
  cmFileCopier::~cmFileCopier(&this->super_cmFileCopier);
  return;
}

Assistant:

cmFileInstaller::~cmFileInstaller()
{
  // Save the updated install manifest.
  this->Makefile->AddDefinition("CMAKE_INSTALL_MANIFEST_FILES",
                                this->Manifest.c_str());
}